

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O1

string * __thiscall
Physical::getDescription_abi_cxx11_(string *__return_storage_ptr__,Physical *this)

{
  pointer pcVar1;
  long lVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_88;
  long local_80;
  long local_78;
  undefined8 uStack_70;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  pcVar1 = (this->physicalUnit).sUnitName._M_dataplus._M_p;
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + (this->physicalUnit).sUnitName._M_string_length);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_80 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->physicalDescription)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (this->physicalDescription)._M_string_length);
    return __return_storage_ptr__;
  }
  pcVar1 = (this->physicalDescription)._M_dataplus._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (this->physicalDescription)._M_string_length);
  std::__cxx11::string::append((char *)&local_68);
  pcVar1 = (this->physicalUnit).sUnitSymbol._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (this->physicalUnit).sUnitSymbol._M_string_length);
  uVar6 = 0xf;
  if (local_68 != local_58) {
    uVar6 = local_58[0];
  }
  if (uVar6 < (ulong)(local_40 + local_60)) {
    uVar6 = 0xf;
    if (local_48 != local_38) {
      uVar6 = local_38[0];
    }
    if ((ulong)(local_40 + local_60) <= uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)local_68);
      goto LAB_0013ff12;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48);
LAB_0013ff12:
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_78 = *plVar4;
    uStack_70 = puVar3[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*puVar3;
  }
  local_80 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string Physical::getDescription()
{
	if (physicalUnit.getName().length())
        return physicalDescription + " (" + physicalUnit.getSymbol() + ")";
	else return physicalDescription;
}